

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xsxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  uint32_t uVar1;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 dst;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  TCGv_i64 exp;
  TCGv_i64 nan;
  TCGv_i64 zr;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 rt;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rD(ctx->opcode);
  ret = cpu_gpr[uVar1];
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    ret_01 = tcg_temp_new_i64(tcg_ctx_00);
    dst = tcg_temp_new_i64(tcg_ctx_00);
    c2 = tcg_const_i64_ppc64(tcg_ctx_00,0);
    c2_00 = tcg_const_i64_ppc64(tcg_ctx_00,0x7ff);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret_00,dst,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,ret_01,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_01,ret_00,c2,c2,ret_01);
    tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_01,ret_00,c2_00,c2,ret_01);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,ret_01,dst,0,0x34);
    tcg_temp_free_i64(tcg_ctx_00,ret_01);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,c2);
    tcg_temp_free_i64(tcg_ctx_00,c2_00);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xsxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv rt = cpu_gpr[rD(ctx->opcode)];
    TCGv_i64 t0, t1, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_extract_i64(tcg_ctx, exp, t1, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_deposit_i64(tcg_ctx, rt, t0, t1, 0, 52);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
}